

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O3

bool __thiscall arm::MemoryOperand::operator==(MemoryOperand *this,MemoryOperand *other)

{
  bool __ret;
  bool local_29;
  anon_class_16_2_9763bfdf_conflict3 local_28;
  
  if (this->kind != other->kind) {
    return false;
  }
  if (this->r1 == other->r1) {
    local_28.__lhs = &this->offset;
    local_28.__ret = &local_29;
    local_29 = true;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<arm::RegisterOperand,_short>_&>
      ::_S_vtable._M_arr
      [(long)(char)*(__index_type *)
                    ((long)&(other->offset).super__Variant_base<arm::RegisterOperand,_short>.
                            super__Move_assign_alias<arm::RegisterOperand,_short>.
                            super__Copy_assign_alias<arm::RegisterOperand,_short>.
                            super__Move_ctor_alias<arm::RegisterOperand,_short>.
                            super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                            super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10) + 1].
      _M_data)(&local_28,&other->offset);
    if (local_29 == true) {
      if (*(__index_type *)
           ((long)&(other->offset).super__Variant_base<arm::RegisterOperand,_short>.
                   super__Move_assign_alias<arm::RegisterOperand,_short>.
                   super__Copy_assign_alias<arm::RegisterOperand,_short>.
                   super__Move_ctor_alias<arm::RegisterOperand,_short>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                   super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10) != '\0' ||
          *(__index_type *)
           ((long)&(this->offset).super__Variant_base<arm::RegisterOperand,_short>.
                   super__Move_assign_alias<arm::RegisterOperand,_short>.
                   super__Copy_assign_alias<arm::RegisterOperand,_short>.
                   super__Move_ctor_alias<arm::RegisterOperand,_short>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_short>.
                   super__Variant_storage_alias<arm::RegisterOperand,_short> + 0x10) != '\0') {
        return true;
      }
      return this->neg_rm == other->neg_rm;
    }
  }
  return false;
}

Assistant:

bool operator==(const MemoryOperand& other) const {
    auto r =
        (kind == other.kind) && (r1 == other.r1) && (offset == other.offset);
    if (!r) return r;
    if (offset.index() == other.offset.index() && offset.index() == 0)
      return r && (neg_rm == other.neg_rm);
    else
      return r;
  }